

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr6r700sixx.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  IkSolutionBase<double> *pIVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar5;
  size_t j;
  long lVar6;
  value_type_conflict1 *__val;
  ulong index;
  IkSolutionList<double> solutions;
  IkReal eetrans [3];
  IkReal eerot [9];
  IKSolver solver;
  allocator_type local_309;
  IkSolutionList<double> local_308;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  double local_288;
  IKSolver local_280;
  
  if (argc == 0xd) {
    local_308._listsolutions.
    super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_308._listsolutions;
    local_308.super_IkSolutionListBase<double>._vptr_IkSolutionListBase =
         (_func_int **)&PTR__IkSolutionList_00138c18;
    local_308._listsolutions.
    super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>.
    _M_impl._M_node._M_size = 0;
    local_308._listsolutions.
    super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>.
    _M_impl._M_node.super__List_node_base._M_prev =
         local_308._listsolutions.
         super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>.
         _M_impl._M_node.super__List_node_base._M_next;
    local_2c8 = atof(argv[1]);
    local_2c0 = atof(argv[2]);
    local_2b8 = atof(argv[3]);
    local_2e8 = atof(argv[4]);
    local_2b0 = atof(argv[5]);
    local_2a8 = atof(argv[6]);
    local_2a0 = atof(argv[7]);
    local_2e0 = atof(argv[8]);
    local_298 = atof(argv[9]);
    local_290 = atof(argv[10]);
    local_288 = atof(argv[0xb]);
    local_2d8 = atof(argv[0xc]);
    bVar1 = IKSolver::ComputeIk(&local_280,&local_2e8,&local_2c8,(IkReal *)0x0,
                                &local_308.super_IkSolutionListBase<double>);
    if (bVar1) {
      printf("Found %d ik solutions:\n",
             local_308._listsolutions.
             super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>
             ._M_impl._M_node._M_size & 0xffffffff);
      puVar3 = (undefined8 *)operator_new(0x30);
      puVar3[4] = 0;
      puVar3[5] = 0;
      puVar3[2] = 0;
      puVar3[3] = 0;
      *puVar3 = 0;
      puVar3[1] = 0;
      if (local_308._listsolutions.
          super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>
          ._M_impl._M_node._M_size != 0) {
        index = 0;
        do {
          pIVar4 = ikfast::IkSolutionList<double>::GetSolution(&local_308,index);
          iVar2 = (*pIVar4->_vptr_IkSolutionBase[4])(pIVar4);
          printf("sol%d (free=%d): ",index & 0xffffffff,
                 (ulong)(((long *)CONCAT44(extraout_var,iVar2))[1] -
                        *(long *)CONCAT44(extraout_var,iVar2)) >> 2);
          iVar2 = (*pIVar4->_vptr_IkSolutionBase[4])(pIVar4);
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)&local_280,
                     ((long *)CONCAT44(extraout_var_00,iVar2))[1] -
                     *(long *)CONCAT44(extraout_var_00,iVar2) >> 2,&local_309);
          pvVar5 = (void *)0x0;
          if (local_280.cj0 != local_280.j0) {
            pvVar5 = (void *)local_280.j0;
          }
          (*pIVar4->_vptr_IkSolutionBase[2])(pIVar4,puVar3,pvVar5);
          lVar6 = 0;
          do {
            printf("%.15f, ",(int)puVar3[lVar6]);
            lVar6 = lVar6 + 1;
          } while (lVar6 != 6);
          putchar(10);
          if ((void *)local_280.j0 != (void *)0x0) {
            operator_delete((void *)local_280.j0,(long)local_280.sj0 - (long)local_280.j0);
          }
          index = index + 1;
        } while (index < local_308._listsolutions.
                         super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>
                         ._M_impl._M_node._M_size);
      }
      operator_delete(puVar3,0x30);
      iVar2 = 0;
    }
    else {
      main_cold_1();
      iVar2 = -1;
    }
    local_308.super_IkSolutionListBase<double>._vptr_IkSolutionListBase =
         (_func_int **)&PTR__IkSolutionList_00138c18;
    std::__cxx11::
    _List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>::_M_clear
              (&local_308._listsolutions.
                super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>
              );
  }
  else {
    printf("\nUsage: ./ik r00 r01 r02 t0 r10 r11 r12 t1 r20 r21 r22 t2 free0 ...\n\nReturns the ik solutions given the transformation of the end effector specified by\na 3x3 rotation R (rXX), and a 3x1 translation (tX).\nThere are %d free parameters that have to be specified.\n\n"
           ,0);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
    if( argc != 12+GetNumFreeParameters()+1 ) {
        printf("\nUsage: ./ik r00 r01 r02 t0 r10 r11 r12 t1 r20 r21 r22 t2 free0 ...\n\n"
               "Returns the ik solutions given the transformation of the end effector specified by\n"
               "a 3x3 rotation R (rXX), and a 3x1 translation (tX).\n"
               "There are %d free parameters that have to be specified.\n\n",GetNumFreeParameters());
        return 1;
    }

    IkSolutionList<IkReal> solutions;
    std::vector<IkReal> vfree(GetNumFreeParameters());
    IkReal eerot[9],eetrans[3];
    eerot[0] = atof(argv[1]); eerot[1] = atof(argv[2]); eerot[2] = atof(argv[3]); eetrans[0] = atof(argv[4]);
    eerot[3] = atof(argv[5]); eerot[4] = atof(argv[6]); eerot[5] = atof(argv[7]); eetrans[1] = atof(argv[8]);
    eerot[6] = atof(argv[9]); eerot[7] = atof(argv[10]); eerot[8] = atof(argv[11]); eetrans[2] = atof(argv[12]);
    for(std::size_t i = 0; i < vfree.size(); ++i)
        vfree[i] = atof(argv[13+i]);
    bool bSuccess = ComputeIk(eetrans, eerot, vfree.size() > 0 ? &vfree[0] : NULL, solutions);

    if( !bSuccess ) {
        fprintf(stderr,"Failed to get ik solution\n");
        return -1;
    }

    printf("Found %d ik solutions:\n", (int)solutions.GetNumSolutions());
    std::vector<IkReal> solvalues(GetNumJoints());
    for(std::size_t i = 0; i < solutions.GetNumSolutions(); ++i) {
        const IkSolutionBase<IkReal>& sol = solutions.GetSolution(i);
        printf("sol%d (free=%d): ", (int)i, (int)sol.GetFree().size());
        std::vector<IkReal> vsolfree(sol.GetFree().size());
        sol.GetSolution(&solvalues[0],vsolfree.size()>0?&vsolfree[0]:NULL);
        for( std::size_t j = 0; j < solvalues.size(); ++j)
            printf("%.15f, ", solvalues[j]);
        printf("\n");
    }
    return 0;
}